

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

void Js::JavascriptNativeArray::PopWithNoDst(ScriptContext *scriptContext,Var nativeArray)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JavascriptArray *arr;
  
  bVar2 = VarIs<Js::JavascriptNativeArray>(nativeArray);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x136e,"(VarIs<JavascriptNativeArray>(nativeArray))",
                                "VarIs<JavascriptNativeArray>(nativeArray)");
    if (!bVar2) goto LAB_00b76298;
    *puVar3 = 0;
  }
  arr = VarTo<Js::JavascriptArray>(nativeArray);
  if ((arr->super_ArrayObject).length == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x1372,"(arr->GetLength() != 0)","arr->GetLength() != 0");
    if (!bVar2) {
LAB_00b76298:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  bVar2 = JavascriptArray::HasAnyES5ArrayInPrototypeChain(arr,false);
  if (bVar2) {
    JavascriptArray::EntryPopJavascriptArray(scriptContext,arr);
    return;
  }
  JavascriptArray::SetLength(arr,(arr->super_ArrayObject).length - 1);
  return;
}

Assistant:

void JavascriptNativeArray::PopWithNoDst(ScriptContext* scriptContext, Var nativeArray)
    {
        JIT_HELPER_REENTRANT_HEADER(Array_NativePopWithNoDst);
        Assert(VarIs<JavascriptNativeArray>(nativeArray));
        JavascriptArray * arr = VarTo<JavascriptArray>(nativeArray);

        // we will bailout on length 0
        Assert(arr->GetLength() != 0);

        // Check for SparseArray and also has array in prototype chain
        if (JavascriptArray::HasAnyES5ArrayInPrototypeChain(arr, false)) {
            // Pop (walk chain) and discard the result
            EntryPopJavascriptArray(scriptContext, arr);
            return;
        }

        uint32 index = arr->GetLength() - 1;
        arr->SetLength(index);
        JIT_HELPER_END(Array_NativePopWithNoDst);
    }